

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_convolve_copy_sse2.c
# Opt level: O3

void aom_convolve_copy_sse2
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,int w,int h)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  
  if (w < 0x10) {
    if (w == 2) {
      do {
        *(undefined2 *)dst = *(undefined2 *)src;
        puVar1 = src + src_stride;
        src = src + src_stride * 2;
        *(undefined2 *)(dst + dst_stride) = *(undefined2 *)puVar1;
        dst = dst + dst_stride * 2;
        h = h + -2;
      } while (h != 0);
      return;
    }
    if (w == 4) {
      do {
        *(undefined4 *)dst = *(undefined4 *)src;
        puVar1 = src + src_stride;
        src = src + src_stride * 2;
        *(undefined4 *)(dst + dst_stride) = *(undefined4 *)puVar1;
        dst = dst + dst_stride * 2;
        h = h + -2;
      } while (h != 0);
      return;
    }
    if (w == 8) {
      do {
        uVar2 = *(undefined8 *)src;
        uVar3 = *(undefined8 *)(src + src_stride);
        src = src + src_stride * 2;
        *(undefined8 *)dst = uVar2;
        *(undefined8 *)(dst + dst_stride) = uVar3;
        dst = dst + dst_stride * 2;
        h = h + -2;
      } while (h != 0);
      return;
    }
  }
  else {
    if (w == 0x10) {
      do {
        uVar2 = *(undefined8 *)src;
        uVar3 = *(undefined8 *)(src + 8);
        uVar4 = *(undefined8 *)(src + src_stride);
        uVar5 = *(undefined8 *)(src + src_stride + 8);
        src = src + src_stride * 2;
        *(undefined8 *)dst = uVar2;
        *(undefined8 *)(dst + 8) = uVar3;
        *(undefined8 *)(dst + dst_stride) = uVar4;
        *(undefined8 *)(dst + dst_stride + 8) = uVar5;
        dst = dst + dst_stride * 2;
        h = h + -2;
      } while (h != 0);
      return;
    }
    if (w == 0x20) {
      do {
        uVar2 = *(undefined8 *)src;
        uVar3 = *(undefined8 *)(src + 8);
        uVar4 = *(undefined8 *)(src + 0x10);
        uVar5 = *(undefined8 *)(src + 0x18);
        uVar6 = *(undefined8 *)(src + src_stride);
        uVar7 = *(undefined8 *)(src + src_stride + 8);
        uVar8 = *(undefined8 *)(src + src_stride + 0x10);
        uVar9 = *(undefined8 *)(src + src_stride + 0x10 + 8);
        src = src + src_stride * 2;
        *(undefined8 *)dst = uVar2;
        *(undefined8 *)(dst + 8) = uVar3;
        *(undefined8 *)(dst + 0x10) = uVar4;
        *(undefined8 *)(dst + 0x18) = uVar5;
        *(undefined8 *)(dst + dst_stride) = uVar6;
        *(undefined8 *)(dst + dst_stride + 8) = uVar7;
        *(undefined8 *)(dst + dst_stride + 0x10) = uVar8;
        *(undefined8 *)(dst + dst_stride + 0x10 + 8) = uVar9;
        dst = dst + dst_stride * 2;
        h = h + -2;
      } while (h != 0);
      return;
    }
    if (w == 0x40) {
      do {
        uVar2 = *(undefined8 *)src;
        uVar3 = *(undefined8 *)(src + 8);
        uVar4 = *(undefined8 *)(src + 0x10);
        uVar5 = *(undefined8 *)(src + 0x18);
        uVar6 = *(undefined8 *)(src + 0x20);
        uVar7 = *(undefined8 *)(src + 0x28);
        uVar8 = *(undefined8 *)(src + 0x30);
        uVar9 = *(undefined8 *)(src + 0x38);
        uVar10 = *(undefined8 *)(src + src_stride);
        uVar11 = *(undefined8 *)(src + src_stride + 8);
        uVar12 = *(undefined8 *)(src + src_stride + 0x10);
        uVar13 = *(undefined8 *)(src + src_stride + 0x10 + 8);
        uVar14 = *(undefined8 *)(src + src_stride + 0x20);
        uVar15 = *(undefined8 *)(src + src_stride + 0x20 + 8);
        uVar16 = *(undefined8 *)(src + src_stride + 0x30);
        uVar17 = *(undefined8 *)(src + src_stride + 0x30 + 8);
        src = src + src_stride * 2;
        *(undefined8 *)dst = uVar2;
        *(undefined8 *)(dst + 8) = uVar3;
        *(undefined8 *)(dst + 0x10) = uVar4;
        *(undefined8 *)(dst + 0x18) = uVar5;
        *(undefined8 *)(dst + 0x20) = uVar6;
        *(undefined8 *)(dst + 0x28) = uVar7;
        *(undefined8 *)(dst + 0x30) = uVar8;
        *(undefined8 *)(dst + 0x38) = uVar9;
        *(undefined8 *)(dst + dst_stride) = uVar10;
        *(undefined8 *)(dst + dst_stride + 8) = uVar11;
        *(undefined8 *)(dst + dst_stride + 0x10) = uVar12;
        *(undefined8 *)(dst + dst_stride + 0x10 + 8) = uVar13;
        *(undefined8 *)(dst + dst_stride + 0x20) = uVar14;
        *(undefined8 *)(dst + dst_stride + 0x20 + 8) = uVar15;
        *(undefined8 *)(dst + dst_stride + 0x30) = uVar16;
        *(undefined8 *)(dst + dst_stride + 0x30 + 8) = uVar17;
        dst = dst + dst_stride * 2;
        h = h + -2;
      } while (h != 0);
      return;
    }
  }
  do {
    uVar2 = *(undefined8 *)(src + 8);
    uVar3 = *(undefined8 *)(src + 0x10);
    uVar4 = *(undefined8 *)(src + 0x18);
    uVar5 = *(undefined8 *)(src + 0x20);
    uVar6 = *(undefined8 *)(src + 0x28);
    uVar7 = *(undefined8 *)(src + 0x30);
    uVar8 = *(undefined8 *)(src + 0x38);
    uVar9 = *(undefined8 *)(src + 0x40);
    uVar10 = *(undefined8 *)(src + 0x48);
    uVar11 = *(undefined8 *)(src + 0x50);
    uVar12 = *(undefined8 *)(src + 0x58);
    uVar13 = *(undefined8 *)(src + 0x60);
    uVar14 = *(undefined8 *)(src + 0x68);
    uVar15 = *(undefined8 *)(src + 0x70);
    uVar16 = *(undefined8 *)(src + 0x78);
    *(undefined8 *)dst = *(undefined8 *)src;
    *(undefined8 *)(dst + 8) = uVar2;
    *(undefined8 *)(dst + 0x10) = uVar3;
    *(undefined8 *)(dst + 0x18) = uVar4;
    *(undefined8 *)(dst + 0x20) = uVar5;
    *(undefined8 *)(dst + 0x28) = uVar6;
    *(undefined8 *)(dst + 0x30) = uVar7;
    *(undefined8 *)(dst + 0x38) = uVar8;
    *(undefined8 *)(dst + 0x40) = uVar9;
    *(undefined8 *)(dst + 0x48) = uVar10;
    *(undefined8 *)(dst + 0x50) = uVar11;
    *(undefined8 *)(dst + 0x58) = uVar12;
    *(undefined8 *)(dst + 0x60) = uVar13;
    *(undefined8 *)(dst + 0x68) = uVar14;
    *(undefined8 *)(dst + 0x70) = uVar15;
    *(undefined8 *)(dst + 0x78) = uVar16;
    puVar1 = src + src_stride;
    uVar2 = *(undefined8 *)(puVar1 + 8);
    uVar3 = *(undefined8 *)(src + src_stride + 0x10);
    uVar4 = *(undefined8 *)(src + src_stride + 0x10 + 8);
    uVar5 = *(undefined8 *)(src + src_stride + 0x20);
    uVar6 = *(undefined8 *)(src + src_stride + 0x20 + 8);
    uVar7 = *(undefined8 *)(src + src_stride + 0x30);
    uVar8 = *(undefined8 *)(src + src_stride + 0x30 + 8);
    uVar9 = *(undefined8 *)(src + src_stride + 0x40);
    uVar10 = *(undefined8 *)(src + src_stride + 0x40 + 8);
    uVar11 = *(undefined8 *)(src + src_stride + 0x50);
    uVar12 = *(undefined8 *)(src + src_stride + 0x50 + 8);
    uVar13 = *(undefined8 *)(src + src_stride + 0x60);
    uVar14 = *(undefined8 *)(src + src_stride + 0x60 + 8);
    uVar15 = *(undefined8 *)(src + src_stride + 0x70);
    uVar16 = *(undefined8 *)(src + src_stride + 0x70 + 8);
    src = src + src_stride * 2;
    *(undefined8 *)(dst + dst_stride) = *(undefined8 *)puVar1;
    *(undefined8 *)(dst + dst_stride + 8) = uVar2;
    *(undefined8 *)(dst + dst_stride + 0x10) = uVar3;
    *(undefined8 *)(dst + dst_stride + 0x10 + 8) = uVar4;
    *(undefined8 *)(dst + dst_stride + 0x20) = uVar5;
    *(undefined8 *)(dst + dst_stride + 0x20 + 8) = uVar6;
    *(undefined8 *)(dst + dst_stride + 0x30) = uVar7;
    *(undefined8 *)(dst + dst_stride + 0x30 + 8) = uVar8;
    *(undefined8 *)(dst + dst_stride + 0x40) = uVar9;
    *(undefined8 *)(dst + dst_stride + 0x40 + 8) = uVar10;
    *(undefined8 *)(dst + dst_stride + 0x50) = uVar11;
    *(undefined8 *)(dst + dst_stride + 0x50 + 8) = uVar12;
    *(undefined8 *)(dst + dst_stride + 0x60) = uVar13;
    *(undefined8 *)(dst + dst_stride + 0x60 + 8) = uVar14;
    *(undefined8 *)(dst + dst_stride + 0x70) = uVar15;
    *(undefined8 *)(dst + dst_stride + 0x70 + 8) = uVar16;
    dst = dst + dst_stride * 2;
    h = h + -2;
  } while (h != 0);
  return;
}

Assistant:

void aom_convolve_copy_sse2(const uint8_t *src, ptrdiff_t src_stride,
                            uint8_t *dst, ptrdiff_t dst_stride, int w, int h) {
  // The w >= 16 cases use _mm_store_si128(), which requires its output address
  // be aligned on a 16-byte boundary.
  if (w >= 16) {
    assert(!((intptr_t)dst % 16));
    assert(!(dst_stride % 16));
  }

  if (w == 2) {
    do {
      memmove(dst, src, 2 * sizeof(*src));
      src += src_stride;
      dst += dst_stride;
      memmove(dst, src, 2 * sizeof(*src));
      src += src_stride;
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 4) {
    do {
      memmove(dst, src, 4 * sizeof(*src));
      src += src_stride;
      dst += dst_stride;
      memmove(dst, src, 4 * sizeof(*src));
      src += src_stride;
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 8) {
    do {
      __m128i s[2];
      s[0] = _mm_loadl_epi64((__m128i *)src);
      src += src_stride;
      s[1] = _mm_loadl_epi64((__m128i *)src);
      src += src_stride;
      _mm_storel_epi64((__m128i *)dst, s[0]);
      dst += dst_stride;
      _mm_storel_epi64((__m128i *)dst, s[1]);
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 16) {
    do {
      __m128i s[2];
      s[0] = _mm_loadu_si128((__m128i *)src);
      src += src_stride;
      s[1] = _mm_loadu_si128((__m128i *)src);
      src += src_stride;
      _mm_store_si128((__m128i *)dst, s[0]);
      dst += dst_stride;
      _mm_store_si128((__m128i *)dst, s[1]);
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 32) {
    do {
      __m128i s[4];
      s[0] = _mm_loadu_si128((__m128i *)(src + 0 * 16));
      s[1] = _mm_loadu_si128((__m128i *)(src + 1 * 16));
      src += src_stride;
      s[2] = _mm_loadu_si128((__m128i *)(src + 0 * 16));
      s[3] = _mm_loadu_si128((__m128i *)(src + 1 * 16));
      src += src_stride;
      _mm_store_si128((__m128i *)(dst + 0 * 16), s[0]);
      _mm_store_si128((__m128i *)(dst + 1 * 16), s[1]);
      dst += dst_stride;
      _mm_store_si128((__m128i *)(dst + 0 * 16), s[2]);
      _mm_store_si128((__m128i *)(dst + 1 * 16), s[3]);
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 64) {
    do {
      __m128i s[8];
      s[0] = _mm_loadu_si128((__m128i *)(src + 0 * 16));
      s[1] = _mm_loadu_si128((__m128i *)(src + 1 * 16));
      s[2] = _mm_loadu_si128((__m128i *)(src + 2 * 16));
      s[3] = _mm_loadu_si128((__m128i *)(src + 3 * 16));
      src += src_stride;
      s[4] = _mm_loadu_si128((__m128i *)(src + 0 * 16));
      s[5] = _mm_loadu_si128((__m128i *)(src + 1 * 16));
      s[6] = _mm_loadu_si128((__m128i *)(src + 2 * 16));
      s[7] = _mm_loadu_si128((__m128i *)(src + 3 * 16));
      src += src_stride;
      _mm_store_si128((__m128i *)(dst + 0 * 16), s[0]);
      _mm_store_si128((__m128i *)(dst + 1 * 16), s[1]);
      _mm_store_si128((__m128i *)(dst + 2 * 16), s[2]);
      _mm_store_si128((__m128i *)(dst + 3 * 16), s[3]);
      dst += dst_stride;
      _mm_store_si128((__m128i *)(dst + 0 * 16), s[4]);
      _mm_store_si128((__m128i *)(dst + 1 * 16), s[5]);
      _mm_store_si128((__m128i *)(dst + 2 * 16), s[6]);
      _mm_store_si128((__m128i *)(dst + 3 * 16), s[7]);
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else {
    do {
      copy_128(src, dst);
      src += src_stride;
      dst += dst_stride;
      copy_128(src, dst);
      src += src_stride;
      dst += dst_stride;
      h -= 2;
    } while (h);
  }
}